

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O1

sljit_s32 emit_shift(sljit_compiler *compiler,sljit_u8 mode,sljit_s32 dst,sljit_sw dstw,
                    sljit_s32 src1,sljit_sw src1w,sljit_s32 src2,sljit_sw src2w)

{
  sljit_s32 sVar1;
  byte *pbVar2;
  sljit_u8 *psVar3;
  
  if (src2 == 4 || (src2 & 0x40U) != 0) {
    if (dstw == src1w && dst == src1) {
      pbVar2 = emit_x86_instruction(compiler,0x21,src2,src2w,dst,dstw);
      if (pbVar2 != (byte *)0x0) {
        *pbVar2 = *pbVar2 | mode;
        return 0;
      }
      goto LAB_00155fa7;
    }
    if (dst == 0) {
      sVar1 = emit_mov(compiler,0xf,0,src1,src1w);
      if (sVar1 != 0) goto LAB_00155fa7;
      dst = 0xf;
    }
    else {
      if (dst == 4 && src2 == 4) {
        sVar1 = 0xf;
        goto LAB_00155c40;
      }
      if (0x3f < dst) {
        sVar1 = emit_mov(compiler,0xf,0,src1,src1w);
        if ((sVar1 != 0) ||
           (pbVar2 = emit_x86_instruction(compiler,0x21,src2,src2w,0xf,0), pbVar2 == (byte *)0x0))
        goto LAB_00155fa7;
        *pbVar2 = *pbVar2 | mode;
        goto LAB_00155c91;
      }
      sVar1 = emit_mov(compiler,dst,0,src1,src1w);
      if (sVar1 != 0) goto LAB_00155fa7;
    }
    pbVar2 = emit_x86_instruction(compiler,0x21,src2,src2w,dst,0);
    if (pbVar2 != (byte *)0x0) {
      *pbVar2 = *pbVar2 | mode;
      return 0;
    }
  }
  else {
    if (dst == 4) {
      sVar1 = emit_mov(compiler,0xf,0,src1,src1w);
      if (sVar1 != 0) goto LAB_00155fa7;
      sVar1 = 4;
      src1w = src2w;
      src1 = src2;
LAB_00155c40:
      sVar1 = emit_mov(compiler,sVar1,0,src1,src1w);
      if (sVar1 != 0) goto LAB_00155fa7;
      dst = 0xf;
    }
    else {
      if ((dst == src2 || dst - 0x40U < 0xffffffc1) ||
         (((char)src2 < '\0' && (((src2 & 0x3fU) == dst || (((uint)src2 >> 8 & 0x3f) == dst)))))) {
        sVar1 = emit_mov(compiler,0xf,0,src1,src1w);
        if (sVar1 != 0) goto LAB_00155fa7;
        psVar3 = emit_x86_instruction(compiler,1,4,0,0x10,0);
        if (psVar3 == (sljit_u8 *)0x0) {
          if (compiler->error != 0) goto LAB_00155fa7;
        }
        else {
          *psVar3 = 0x89;
        }
        sVar1 = emit_mov(compiler,4,0,src2,src2w);
        if ((sVar1 != 0) ||
           (pbVar2 = emit_x86_instruction(compiler,0x21,4,0,0xf,0), pbVar2 == (byte *)0x0))
        goto LAB_00155fa7;
        *pbVar2 = *pbVar2 | mode;
        psVar3 = emit_x86_instruction(compiler,1,0x10,0,4,0);
        if (psVar3 == (sljit_u8 *)0x0) {
          if (compiler->error != 0) goto LAB_00155fa7;
        }
        else {
          *psVar3 = 0x89;
        }
        if (dst == 0) {
          return 0;
        }
        psVar3 = emit_x86_instruction(compiler,1,0xf,0,dst,dstw);
        if (psVar3 == (sljit_u8 *)0x0) goto LAB_00155fa7;
        goto LAB_00155c9f;
      }
      if ((src1 != dst) && (sVar1 = emit_mov(compiler,dst,0,src1,src1w), sVar1 != 0))
      goto LAB_00155fa7;
      psVar3 = emit_x86_instruction(compiler,1,4,0,0xf,0);
      if (psVar3 == (sljit_u8 *)0x0) {
        if (compiler->error != 0) goto LAB_00155fa7;
      }
      else {
        *psVar3 = 0x89;
      }
      sVar1 = emit_mov(compiler,4,0,src2,src2w);
      if (sVar1 != 0) goto LAB_00155fa7;
    }
    pbVar2 = emit_x86_instruction(compiler,0x21,4,0,dst,0);
    if (pbVar2 == (byte *)0x0) goto LAB_00155fa7;
    *pbVar2 = *pbVar2 | mode;
    dst = 4;
    dstw = 0;
LAB_00155c91:
    psVar3 = emit_x86_instruction(compiler,1,0xf,0,dst,dstw);
    if (psVar3 != (sljit_u8 *)0x0) {
LAB_00155c9f:
      *psVar3 = 0x89;
      return 0;
    }
    if (compiler->error == 0) {
      return 0;
    }
  }
LAB_00155fa7:
  return compiler->error;
}

Assistant:

static sljit_s32 emit_shift(struct sljit_compiler *compiler,
	sljit_u8 mode,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src1, sljit_sw src1w,
	sljit_s32 src2, sljit_sw src2w)
{
	sljit_u8* inst;

	if ((src2 & SLJIT_IMM) || (src2 == SLJIT_PREF_SHIFT_REG)) {
		if (dst == src1 && dstw == src1w) {
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, dst, dstw);
			FAIL_IF(!inst);
			*inst |= mode;
			return SLJIT_SUCCESS;
		}
		if (dst == SLJIT_UNUSED) {
			EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, TMP_REG1, 0);
			FAIL_IF(!inst);
			*inst |= mode;
			return SLJIT_SUCCESS;
		}
		if (dst == SLJIT_PREF_SHIFT_REG && src2 == SLJIT_PREF_SHIFT_REG) {
			EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
			FAIL_IF(!inst);
			*inst |= mode;
			EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
			return SLJIT_SUCCESS;
		}
		if (FAST_IS_REG(dst)) {
			EMIT_MOV(compiler, dst, 0, src1, src1w);
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, dst, 0);
			FAIL_IF(!inst);
			*inst |= mode;
			return SLJIT_SUCCESS;
		}

		EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, dst, dstw, TMP_REG1, 0);
		return SLJIT_SUCCESS;
	}

	if (dst == SLJIT_PREF_SHIFT_REG) {
		EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
	}
	else if (SLOW_IS_REG(dst) && dst != src2 && !ADDRESSING_DEPENDS_ON(src2, dst)) {
		if (src1 != dst)
			EMIT_MOV(compiler, dst, 0, src1, src1w);
		EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_PREF_SHIFT_REG, 0);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, dst, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
	}
	else {
		/* This case is complex since ecx itself may be used for
		   addressing, and this case must be supported as well. */
		EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
		EMIT_MOV(compiler, SLJIT_MEM1(SLJIT_SP), 0, SLJIT_PREF_SHIFT_REG, 0);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, SLJIT_MEM1(SLJIT_SP), 0);
#else
		EMIT_MOV(compiler, TMP_REG2, 0, SLJIT_PREF_SHIFT_REG, 0);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG2, 0);
#endif
		if (dst != SLJIT_UNUSED)
			return emit_mov(compiler, dst, dstw, TMP_REG1, 0);
	}

	return SLJIT_SUCCESS;
}